

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O2

void __thiscall
TEST_SimpleStringInternalCache_deallocatingLargeMemoryThatWasntAllocatedWhileCacheWasInPlaceProducesWarningButOnlyOnce_Test
::testBody(TEST_SimpleStringInternalCache_deallocatingLargeMemoryThatWasntAllocatedWhileCacheWasInPlaceProducesWarningButOnlyOnce_Test
           *this)

{
  UtestShell *pUVar1;
  SimpleString *this_00;
  size_t sVar2;
  TestTerminator *pTVar3;
  TestTestingFixture *this_01;
  SimpleString local_28;
  
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).testFunction.testFunction =
       deallocatingStringMemoryTwiceThatWasntAllocatedWithCache_;
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).testFunction.allocationSize =
       0x3039;
  SimpleStringInternalCache::setAllocator
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).cache,
             &((this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).allocator)->
              super_TestMemoryAllocator);
  this_01 = &(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).fixture;
  TestTestingFixture::runAllTests(this_01);
  pUVar1 = UtestShell::getCurrent();
  this_00 = TestTestingFixture::getOutput(this_01);
  SimpleString::SimpleString(&local_28,"WARNING");
  sVar2 = SimpleString::count(this_00,&local_28);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0xe])
            (pUVar1,1,sVar2,"LONGS_EQUAL(1, fixture.getOutput().count(\"WARNING\")) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringCacheTest.cpp"
             ,0x143,pTVar3);
  SimpleString::~SimpleString(&local_28);
  return;
}

Assistant:

TEST(SimpleStringInternalCache, deallocatingLargeMemoryThatWasntAllocatedWhileCacheWasInPlaceProducesWarningButOnlyOnce)
{
    testFunction.testFunction = deallocatingStringMemoryTwiceThatWasntAllocatedWithCache_;
    testFunction.allocationSize = 12345;

    cache.setAllocator(allocator);
    fixture.runAllTests();

    LONGS_EQUAL(1, fixture.getOutput().count("WARNING"));
}